

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRCodecMode.cpp
# Opt level: O3

CodecMode ZXing::QRCode::CodecModeForBits(int bits,Type type)

{
  ulong uVar1;
  long *plVar2;
  undefined *puVar3;
  uint uVar4;
  uint *local_38;
  long local_30;
  uint local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if (type == rMQR) {
    if (7 < bits) goto LAB_0017e21b;
    uVar1 = (ulong)bits;
    puVar3 = &DAT_0019e130;
  }
  else if (type == Micro) {
    if (3 < bits) {
LAB_0017e21b:
      plVar2 = (long *)__cxa_allocate_exception(0x30);
      local_38 = &local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Invalid codec mode","");
      *plVar2 = (long)(plVar2 + 2);
      if (local_38 == &local_28) {
        *(uint *)(plVar2 + 2) = local_28;
        *(undefined4 *)((long)plVar2 + 0x14) = uStack_24;
        *(undefined4 *)(plVar2 + 3) = uStack_20;
        *(undefined4 *)((long)plVar2 + 0x1c) = uStack_1c;
      }
      else {
        *plVar2 = (long)local_38;
        plVar2[2] = CONCAT44(uStack_24,local_28);
      }
      plVar2[1] = local_30;
      local_30 = 0;
      local_28 = local_28 & 0xffffff00;
      plVar2[4] = (long)"src/qrcode/QRCodecMode.cpp";
      *(undefined2 *)(plVar2 + 5) = 0x24;
      *(undefined1 *)((long)plVar2 + 0x2a) = 1;
      local_38 = &local_28;
      __cxa_throw(plVar2,&Error::typeinfo,Error::~Error);
    }
    uVar1 = (ulong)bits;
    puVar3 = &DAT_0019e0a0;
  }
  else {
    if ((uint)bits < 6) {
      return bits;
    }
    uVar4 = bits - 7;
    if ((6 < uVar4) || ((0x47U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_0017e21b;
    uVar1 = (ulong)uVar4;
    puVar3 = &DAT_0019e110;
  }
  return *(CodecMode *)(puVar3 + uVar1 * 4);
}

Assistant:

CodecMode CodecModeForBits(int bits, Type type)
{
	if (type == Type::Micro) {
		constexpr CodecMode Bits2Mode[4] = {CodecMode::NUMERIC, CodecMode::ALPHANUMERIC, CodecMode::BYTE, CodecMode::KANJI};
		if (bits < Size(Bits2Mode))
			return Bits2Mode[bits];
	} else if (type == Type::rMQR) {
		constexpr CodecMode Bits2Mode[8] = {
			CodecMode::TERMINATOR, CodecMode::NUMERIC, CodecMode::ALPHANUMERIC, CodecMode::BYTE,
			CodecMode::KANJI, CodecMode::FNC1_FIRST_POSITION, CodecMode::FNC1_SECOND_POSITION, CodecMode::ECI
		};
		if (bits < Size(Bits2Mode))
			return Bits2Mode[bits];
	} else {
		if ((bits >= 0x00 && bits <= 0x05) || (bits >= 0x07 && bits <= 0x09) || bits == 0x0d)
			return static_cast<CodecMode>(bits);
	}

	throw FormatError("Invalid codec mode");
}